

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_export_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL box [6];
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT child_index;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID ref_grid_local;
  REF_DBL *bbox_local;
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  if (ref_oct->children[node << 3] == -1) {
    if (ref_oct->nodes[node * 0x1b + 0x1a] == -1) {
      uVar1 = ref_oct_export_whole(ref_oct,node,bbox,ref_grid);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x3fd
               ,"ref_oct_export_node",(ulong)uVar1,"whole");
        return uVar1;
      }
    }
    else {
      uVar1 = ref_oct_export_steiner(ref_oct,node,bbox,ref_grid);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x3ff
               ,"ref_oct_export_node",(ulong)uVar1,"whole");
        return uVar1;
      }
    }
  }
  else {
    for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < 0x1b;
        ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
      if ((long)ref_oct->nodes[ref_private_status_reis_ai._4_4_ + node * 0x1b] != -1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x406
               ,"ref_oct_export_node","interor node with grid node",0xffffffffffffffff,
               (long)ref_oct->nodes[ref_private_status_reis_ai._4_4_ + node * 0x1b]);
        return 1;
      }
    }
    for (ref_private_status_reis_ai._0_4_ = 0; (int)ref_private_status_reis_ai < 8;
        ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
      uVar1 = ref_oct_child_bbox(bbox,(int)ref_private_status_reis_ai,
                                 (REF_DBL *)&ref_private_macro_code_rss_3);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x409
               ,"ref_oct_export_node",(ulong)uVar1,"bbox");
        return uVar1;
      }
      uVar1 = ref_oct_export_node(ref_oct,ref_oct->children
                                          [(int)ref_private_status_reis_ai + node * 8],
                                  (REF_DBL *)&ref_private_macro_code_rss_3,ref_grid);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x40d
               ,"ref_oct_export_node",(ulong)uVar1,"recurse");
        return uVar1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_node(REF_OCT ref_oct, REF_INT node,
                                              REF_DBL *bbox,
                                              REF_GRID ref_grid) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    if (REF_EMPTY == ref_oct_c2n(ref_oct, 26, node)) {
      RSS(ref_oct_export_whole(ref_oct, node, bbox, ref_grid), "whole");
    } else {
      RSS(ref_oct_export_steiner(ref_oct, node, bbox, ref_grid), "whole");
    }
  } else {
    REF_INT i;
    REF_INT child_index;
    for (i = 0; i < 27; i++)
      REIS(REF_EMPTY, ref_oct_c2n(ref_oct, i, node),
           "interor node with grid node");
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_export_node(ref_oct,
                              ref_oct_child(ref_oct, child_index, node), box,
                              ref_grid),
          "recurse");
    }
  }
  return REF_SUCCESS;
}